

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O1

uint32_t __thiscall ImgfsFile::allocchunk(ImgfsFile *this,uint size,chunktype_t tag)

{
  uint uVar1;
  pointer pcVar2;
  uint __count;
  __normal_iterator<ImgfsFile::chunktype_t_*,_std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>_>
  _Var3;
  undefined8 *puVar4;
  uint32_t uVar5;
  long lVar6;
  long lVar7;
  chunktype_t *pcVar8;
  string str;
  reverse_iterator<__gnu_cxx::__normal_iterator<ImgfsFile::chunktype_t_*,_std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>_>_>
  last;
  chunktype_t *local_68;
  undefined8 local_60;
  chunktype_t local_58;
  undefined7 uStack_57;
  chunkmap_t *local_48;
  long local_40;
  pointer local_38;
  
  if (size == 0) {
    uVar5 = 0;
  }
  else {
    uVar1 = (this->_hdr).bytesperchunk;
    if (size % uVar1 != 0) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = "allocchunk: unaligned size";
      __cxa_throw(puVar4,&char_const*::typeinfo,0);
    }
    __count = (uint)((ulong)size / (ulong)uVar1);
    local_68 = (chunktype_t *)CONCAT71(local_68._1_7_,0x20);
    _Var3 = std::
            __search_n<__gnu_cxx::__normal_iterator<ImgfsFile::chunktype_t*,std::vector<ImgfsFile::chunktype_t,std::allocator<ImgfsFile::chunktype_t>>>,unsigned_int,__gnu_cxx::__ops::_Iter_equals_val<ImgfsFile::chunktype_t_const>>
                      ((__normal_iterator<ImgfsFile::chunktype_t_*,_std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>_>
                        )(this->_chunkmap).
                         super__Vector_base<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<ImgfsFile::chunktype_t_*,_std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>_>
                        )(this->_chunkmap).
                         super__Vector_base<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>
                         ._M_impl.super__Vector_impl_data._M_finish,__count,
                       (_Iter_equals_val<const_ImgfsFile::chunktype_t>)&local_68);
    local_68 = (this->_chunkmap).
               super__Vector_base<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    if (_Var3._M_current == local_68) {
      local_48 = &this->_chunkmap;
      local_38 = (this->_chunkmap).
                 super__Vector_base<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      std::
      __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<ImgfsFile::chunktype_t*,std::vector<ImgfsFile::chunktype_t,std::allocator<ImgfsFile::chunktype_t>>>>,__gnu_cxx::__ops::_Iter_pred<ImgfsFile::allocchunk(unsigned_int,ImgfsFile::chunktype_t)::_lambda(ImgfsFile::chunktype_t)_1_>>
                (&local_40);
      pcVar2 = (this->_chunkmap).
               super__Vector_base<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      lVar7 = local_40 - (long)pcVar2;
      lVar6 = (long)pcVar2 -
              (long)(this->_chunkmap).
                    super__Vector_base<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_68 = (chunktype_t *)CONCAT71(local_68._1_7_,0x20);
      std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>::resize
                (local_48,(ulong)(((this->_hdr).chunksperblock - 1 |
                                  ((int)lVar7 + __count + (int)lVar6) - 1) + 1),
                 (value_type *)&local_68);
      _Var3._M_current =
           (this->_chunkmap).
           super__Vector_base<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>.
           _M_impl.super__Vector_impl_data._M_start + lVar7 + lVar6;
    }
    local_68 = &local_58;
    local_60 = 0;
    local_58 = 0;
    if (uVar1 <= size) {
      pcVar8 = _Var3._M_current;
      do {
        std::__cxx11::string::push_back((char)&local_68);
        pcVar8 = pcVar8 + 1;
      } while (pcVar8 != _Var3._M_current + (ulong)size / (ulong)uVar1);
    }
    uVar5 = ((int)_Var3._M_current -
            *(int *)&(this->_chunkmap).
                     super__Vector_base<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>
                     ._M_impl.super__Vector_impl_data._M_start) * (this->_hdr).bytesperchunk;
    markchunk(this,(ulong)uVar5,size,tag);
    if (local_68 != &local_58) {
      operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
    }
  }
  return uVar5;
}

Assistant:

uint32_t allocchunk(unsigned size, chunktype_t tag)
    {
        if (size==0) return 0;
        if (size%_hdr.bytesperchunk)
            throw "allocchunk: unaligned size";

        unsigned n= size/_hdr.bytesperchunk;
        chunkmap_t::iterator i= std::search_n(_chunkmap.begin(), _chunkmap.end(), n, FREECHUNK);
        if (i==_chunkmap.end()) {
            // alloc more space from outer layer ( fffbfffd reader )
            auto last= std::find_if(_chunkmap.rbegin(), _chunkmap.rend(), [](chunktype_t t){ return t!=ImgfsFile::FREECHUNK; });
            size_t nfreeatend= last-_chunkmap.rbegin();
            size_t oldsize= _chunkmap.size();

            _chunkmap.resize(roundsize(_chunkmap.size()+n-nfreeatend, _hdr.chunksperblock), FREECHUNK);

//            printf("added %d chunks\n", (int)(_chunkmap.size()-oldsize));

            i= _chunkmap.begin()+oldsize-nfreeatend;
        }

        chunkmap_t::iterator end= i+n;
        std::string str;
        std::for_each(i, end, [&str](chunktype_t t){ str += (char)t; });

        unsigned ix= i-_chunkmap.begin();
        uint64_t ofs= ix*_hdr.bytesperchunk;
        //printf("allocchunk(%08x) ->: %06x:%06x:%08llx '%s'\n", size, int(i-_chunkmap.begin()), ix, ofs, str.c_str());
        markchunk(ofs, size, tag);
        if (ofs>>32)
            throw "allocchunk: offset too large";
        return (uint32_t)ofs;
    }